

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

ListBuilder *
capnp::_::WireHelpers::getWritableListPointerAnySize
          (ListBuilder *__return_storage_ptr__,WirePointer *origRef,word *origRefTarget,
          SegmentBuilder *origSegment,CapTableBuilder *capTable,word *defaultValue,
          BuilderArena *orphanArena)

{
  Fault ptr_00;
  word *pwVar1;
  word *pwVar2;
  bool bVar3;
  ElementSize size;
  unsigned_short uVar4;
  unsigned_short structPointerCount;
  Kind KVar5;
  WordCountN<17> WVar6;
  ListElementCount size_00;
  BitsPerElementTableType structDataSize;
  PointersPerElementN<1> PVar7;
  ElementCountN<29> size_01;
  size_t *ptr_01;
  uint step;
  uint pointerCount;
  uint dataSize;
  Fault f_1;
  WirePointer *tag;
  ElementSize elementSize;
  Fault local_50;
  Fault f;
  word *ptr;
  SegmentBuilder *segment;
  WirePointer *ref;
  word *defaultValue_local;
  CapTableBuilder *capTable_local;
  SegmentBuilder *origSegment_local;
  word *origRefTarget_local;
  WirePointer *origRef_local;
  
  ref = (WirePointer *)defaultValue;
  defaultValue_local = (word *)capTable;
  capTable_local = (CapTableBuilder *)origSegment;
  origSegment_local = (SegmentBuilder *)origRefTarget;
  origRefTarget_local = (word *)origRef;
  bVar3 = WirePointer::isNull(origRef);
  if (bVar3) goto LAB_001e30cf;
  while( true ) {
    segment = (SegmentBuilder *)origRefTarget_local;
    ptr = (word *)capTable_local;
    f.exception = (Exception *)
                  followFars((WirePointer **)&segment,(word *)origSegment_local,
                             (SegmentBuilder **)&ptr);
    KVar5 = WirePointer::kind((WirePointer *)segment);
    if (KVar5 == LIST) {
      size = WirePointer::ListRef::elementSize
                       ((ListRef *)((long)&(segment->super_SegmentReader).arena + 4));
      if (size == INLINE_COMPOSITE) {
        f_1 = f;
        KVar5 = WirePointer::kind((WirePointer *)f.exception);
        pwVar2 = defaultValue_local;
        pwVar1 = ptr;
        if (KVar5 != STRUCT) {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[62]>
                    ((Fault *)&pointerCount,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x575,FAILED,"tag->kind() == WirePointer::STRUCT",
                     "\"INLINE_COMPOSITE list with non-STRUCT elements not supported.\"",
                     (char (*) [62])"INLINE_COMPOSITE list with non-STRUCT elements not supported.")
          ;
          kj::_::Debug::Fault::fatal((Fault *)&pointerCount);
        }
        ptr_01 = &((f.exception)->ownFile).content.size_;
        f.exception = (Exception *)ptr_01;
        WVar6 = WirePointer::StructRef::wordSize
                          ((StructRef *)((long)&((f_1.exception)->ownFile).content.ptr + 4));
        size_00 = WirePointer::inlineCompositeListElementCount((WirePointer *)f_1.exception);
        uVar4 = DirectWireValue<unsigned_short>::get
                          ((DirectWireValue<unsigned_short> *)
                           ((long)&((f_1.exception)->ownFile).content.ptr + 4));
        structPointerCount =
             DirectWireValue<unsigned_short>::get
                       ((DirectWireValue<unsigned_short> *)
                        ((long)&((f_1.exception)->ownFile).content.ptr + 6));
        ListBuilder::ListBuilder
                  (__return_storage_ptr__,(SegmentBuilder *)pwVar1,(CapTableBuilder *)pwVar2,ptr_01,
                   WVar6 << 6,size_00,(uint)uVar4 << 6,structPointerCount,INLINE_COMPOSITE);
      }
      else {
        structDataSize = dataBitsPerElement(size);
        PVar7 = pointersPerElement(size);
        pwVar2 = defaultValue_local;
        pwVar1 = ptr;
        ptr_00 = f;
        size_01 = WirePointer::ListRef::elementCount
                            ((ListRef *)((long)&(segment->super_SegmentReader).arena + 4));
        ListBuilder::ListBuilder
                  (__return_storage_ptr__,(SegmentBuilder *)pwVar1,(CapTableBuilder *)pwVar2,
                   ptr_00.exception,structDataSize + PVar7 * 0x40,size_01,structDataSize,
                   (StructPointerCount)PVar7,size);
      }
      return __return_storage_ptr__;
    }
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[75]>
              (&local_50,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
               ,0x56b,FAILED,"ref->kind() == WirePointer::LIST",
               "\"Called getWritableListPointerAnySize() but existing pointer is not a list.\"",
               (char (*) [75])
               "Called getWritableListPointerAnySize() but existing pointer is not a list.");
    kj::_::Debug::Fault::~Fault(&local_50);
LAB_001e30cf:
    if ((ref == (WirePointer *)0x0) || (bVar3 = WirePointer::isNull(ref), bVar3)) break;
    origSegment_local =
         (SegmentBuilder *)
         copyMessage((SegmentBuilder **)&capTable_local,(CapTableBuilder *)defaultValue_local,
                     (WirePointer **)&origRefTarget_local,ref);
    ref = (WirePointer *)0x0;
  }
  ListBuilder::ListBuilder(__return_storage_ptr__,VOID);
  return __return_storage_ptr__;
}

Assistant:

static KJ_ALWAYS_INLINE(ListBuilder getWritableListPointerAnySize(
      WirePointer* origRef, word* origRefTarget,
      SegmentBuilder* origSegment, CapTableBuilder* capTable,
      const word* defaultValue, BuilderArena* orphanArena = nullptr)) {
    if (origRef->isNull()) {
    useDefault:
      if (defaultValue == nullptr ||
          reinterpret_cast<const WirePointer*>(defaultValue)->isNull()) {
        return ListBuilder(ElementSize::VOID);
      }
      origRefTarget = copyMessage(
          origSegment, capTable, origRef, reinterpret_cast<const WirePointer*>(defaultValue));
      defaultValue = nullptr;  // If the default value is itself invalid, don't use it again.
    }

    WirePointer* ref = origRef;
    SegmentBuilder* segment = origSegment;
    word* ptr = followFars(ref, origRefTarget, segment);

    KJ_REQUIRE(ref->kind() == WirePointer::LIST,
        "Called getWritableListPointerAnySize() but existing pointer is not a list.") {
      goto useDefault;
    }

    ElementSize elementSize = ref->listRef.elementSize();

    if (elementSize == ElementSize::INLINE_COMPOSITE) {
      // Read the tag to get the actual element count.
      WirePointer* tag = reinterpret_cast<WirePointer*>(ptr);
      KJ_REQUIRE(tag->kind() == WirePointer::STRUCT,
          "INLINE_COMPOSITE list with non-STRUCT elements not supported.");
      ptr += POINTER_SIZE_IN_WORDS;

      return ListBuilder(segment, capTable, ptr,
                         tag->structRef.wordSize() * BITS_PER_WORD / ELEMENTS,
                         tag->inlineCompositeListElementCount(),
                         tag->structRef.dataSize.get() * BITS_PER_WORD,
                         tag->structRef.ptrCount.get(), ElementSize::INLINE_COMPOSITE);
    } else {
      auto dataSize = dataBitsPerElement(elementSize) * ELEMENTS;
      auto pointerCount = pointersPerElement(elementSize) * ELEMENTS;

      auto step = (dataSize + pointerCount * BITS_PER_POINTER) / ELEMENTS;
      return ListBuilder(segment, capTable, ptr, step, ref->listRef.elementCount(),
                         dataSize, pointerCount, elementSize);
    }
  }